

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O1

string_view __thiscall Radix_tree::find(Radix_tree *this,string_view key)

{
  pointer pNVar1;
  pointer this_00;
  string_view sVar2;
  
  if (key._M_len == 0) {
    __assert_fail("t",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/asserts.h"
                  ,0xf,"void assume(T &&) [T = bool]");
  }
  this_00 = (this->children).super__Vector_base<Radix_tree::Node,_std::allocator<Radix_tree::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (this->children).super__Vector_base<Radix_tree::Node,_std::allocator<Radix_tree::Node>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pNVar1) {
    do {
      if (*(this_00->key_part)._M_dataplus._M_p == *key._M_str) {
        sVar2 = Node::find(this_00,key);
        return sVar2;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pNVar1);
  }
  return (string_view)ZEXT816(0);
}

Assistant:

string_view Radix_tree::find(string_view key) const {
	assume(!key.empty()); //not sure what to do in this case yet
	for (auto &child : children) {
		if (child.key_part.front() == key.front()) {
			return child.find(key);
		}
	}
	return {};
}